

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void nivalis::detail::sub_var_ast(AST *ast,int64_t addr,Expr *expr)

{
  pointer pAVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  AST new_ast;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  for (uVar2 = 0;
      pAVar1 = (ast->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(ast->
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4);
      uVar2 = uVar2 + 1) {
    if ((*(int *)((long)&pAVar1->opcode + lVar3) == 2) &&
       (*(long *)((long)&pAVar1->field_1 + lVar3) == addr)) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<nivalis::Expr::ASTNode_const*,std::back_insert_iterator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>
                ((expr->ast).
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (expr->ast).
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 &local_48);
    }
    else {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 &local_48,(value_type *)((long)&pAVar1->opcode + lVar3));
    }
    lVar3 = lVar3 + 0x10;
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator=
            (ast,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 &local_48);
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void sub_var_ast(Expr::AST& ast, int64_t addr, const Expr& expr) {
    Expr::AST new_ast;
    for (size_t i = 0; i < ast.size(); ++i) {
        if (ast[i].opcode == OpCode::ref &&
            ast[i].ref == addr) {
            std::copy(expr.ast.begin(), expr.ast.end(), std::back_inserter(new_ast));
        } else {
            new_ast.push_back(ast[i]);
        }
    }
    ast = new_ast;
}